

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.h
# Opt level: O2

void __thiscall
dynet::RNNBuilder::start_new_sequence
          (RNNBuilder *this,
          vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *h_0)

{
  RNNStateMachine::transition((RNNStateMachine *)(this + 0x10),start_new_sequence);
  *(undefined4 *)(this + 8) = 0xffffffff;
  if (*(long *)(this + 0x20) != *(long *)(this + 0x18)) {
    *(long *)(this + 0x20) = *(long *)(this + 0x18);
  }
  (**(code **)(*(long *)this + 0x60))(this,h_0);
  return;
}

Assistant:

void start_new_sequence(const std::vector<Expression>& h_0 = {}) {
    sm.transition(RNNOp::start_new_sequence);
    cur = RNNPointer(-1);
    head.clear();
    start_new_sequence_impl(h_0);
  }